

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_get_distribution_type(Integer g_a,char *type)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  Integer itype;
  Integer ga_handle;
  
  iVar1 = GA[in_RDI + 1000].distr_type;
  if (iVar1 == 0) {
    strcpy(in_RSI,"regular");
  }
  else if (iVar1 == 1) {
    strcpy(in_RSI,"block_cyclic");
  }
  else if (iVar1 == 2) {
    strcpy(in_RSI,"scalapack");
  }
  else if (iVar1 == 3) {
    strcpy(in_RSI,"tiled");
  }
  else if (iVar1 == 4) {
    strcpy(in_RSI,"tiled_irreg");
  }
  else {
    strcpy(in_RSI,"unknown");
  }
  return;
}

Assistant:

void pnga_get_distribution_type(Integer g_a, char *type)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer itype = GA[ga_handle].distr_type;
  if (itype == REGULAR) {
    strcpy(type,"regular");
  } else if (itype == BLOCK_CYCLIC) {
    strcpy(type,"block_cyclic");
  } else if (itype == SCALAPACK) {
    strcpy(type,"scalapack");
  } else if (itype == TILED) {
    strcpy(type,"tiled");
  } else if (itype == TILED_IRREG) {
    strcpy(type,"tiled_irreg");
  } else {
    strcpy(type,"unknown");
  }
}